

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O2

int check_bb_context(dmr_C *C,entrypoint *ep,basic_block *bb,int entry,int exit)

{
  int iVar1;
  char *pcVar2;
  basic_block *bb_00;
  int current;
  int iVar3;
  ulong uVar4;
  char *in_R9;
  undefined1 local_60 [8];
  ptr_list_iter insniter__;
  
  uVar4 = (ulong)(uint)exit;
  if (bb == (basic_block *)0x0) {
    return 0;
  }
  if (bb->context == entry) {
    return 0;
  }
  if (-1 < bb->context) {
    iVar3 = 0x1020a1;
    iVar1 = exit;
LAB_00101636:
    imbalance(C,ep,bb,iVar3,iVar1,in_R9);
    return -1;
  }
  bb->context = entry;
  ptrlist_forward_iterator(local_60,bb->insns);
  insniter__._16_8_ = 0;
  do {
    iVar3 = (int)insniter__._16_8_ + entry;
LAB_00101678:
    do {
      pcVar2 = (char *)ptrlist_iter_next(local_60);
      iVar1 = (int)uVar4;
      if (pcVar2 == (char *)0x0) {
        iVar3 = insniter__.__nr + entry;
        if (iVar3 < 0) {
          iVar3 = 0x1020c9;
          goto LAB_00101636;
        }
        pcVar2 = (char *)ptrlist_last(bb->insns);
        if (pcVar2 == (char *)0x0) {
          return 0;
        }
        if (*pcVar2 != '\x02') {
          ptrlist_forward_iterator(local_60,bb->children);
          goto LAB_0010172c;
        }
        if (iVar3 == exit) {
          return 0;
        }
        iVar3 = 0x102110;
        goto LAB_00101636;
      }
    } while (*pcVar2 != '>');
    iVar1 = *(int *)(pcVar2 + 0x28);
    if (*(int *)(pcVar2 + 0x2c) != 0) {
      if (iVar1 == 0) {
        if (iVar3 == 0) goto LAB_00101678;
      }
      else if (iVar1 <= iVar3) goto LAB_00101678;
      dmrC_warning(C,*(undefined8 *)(pcVar2 + 0x10),"context check failure");
      goto LAB_00101678;
    }
    insniter__._16_8_ = ZEXT48((uint)(iVar1 + insniter__.__nr));
  } while( true );
  while (iVar1 = check_bb_context(C,ep,bb_00,iVar3,exit), iVar1 == 0) {
LAB_0010172c:
    bb_00 = (basic_block *)ptrlist_iter_next(local_60);
    if (bb_00 == (basic_block *)0x0) break;
  }
  return -(uint)(bb_00 != (basic_block *)0x0);
}

Assistant:

static int check_bb_context(struct dmr_C *C, struct entrypoint *ep, struct basic_block *bb, int entry, int exit)
{
	if (!bb)
		return 0;
	if (bb->context == entry)
		return 0;

	/* Now that's not good.. */
	if (bb->context >= 0)
		return imbalance(C, ep, bb, entry, bb->context, "different lock contexts for basic block");

	bb->context = entry;
	entry += context_increase(C, bb, entry);
	if (entry < 0)
		return imbalance(C, ep, bb, entry, exit, "unexpected unlock");

	return check_children(C, ep, bb, entry, exit);
}